

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashdict.c
# Opt level: O3

int dic_add(dictionary *dic,void *key,int keyn)

{
  keynode **ppkVar1;
  bool bVar2;
  int iVar3;
  uint *puVar4;
  keynode *pkVar5;
  keynode *pkVar6;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  double dVar11;
  double dVar12;
  
  while( true ) {
    uVar8 = 0x811c9dc5;
    puVar4 = (uint *)key;
    uVar9 = keyn;
    uVar10 = keyn;
    if (7 < keyn) {
      do {
        uVar8 = (uVar8 ^ puVar4[1] ^ (*puVar4 << 5 | *puVar4 >> 0x1b)) * 0xad3e7;
        uVar9 = uVar10 - 8;
        puVar4 = puVar4 + 2;
        bVar2 = 0xf < uVar10;
        uVar10 = uVar9;
      } while (bVar2);
    }
    if ((uVar9 & 4) != 0) {
      uVar8 = ((uint)*(ushort *)((long)puVar4 + 2) ^ (uVar8 ^ (ushort)*puVar4) * 0xad3e7) * 0xad3e7;
      puVar4 = puVar4 + 1;
    }
    if ((uVar9 & 2) != 0) {
      uVar8 = (uVar8 ^ (ushort)*puVar4) * 0xad3e7;
      puVar4 = (uint *)((long)puVar4 + 2);
    }
    if ((uVar9 & 1) != 0) {
      uVar8 = (uVar8 ^ (int)(char)*puVar4) * 0xad3e7;
    }
    uVar9 = (uVar8 >> 0x10 ^ uVar8) % (uint)dic->length;
    ppkVar1 = dic->table;
    pkVar6 = ppkVar1[(int)uVar9];
    if (pkVar6 != (keynode *)0x0) break;
    iVar3 = dic->count;
    dVar11 = (double)dic->length;
    dVar12 = (double)iVar3 / dVar11;
    if (dVar12 < dic->growth_treshold || dVar12 == dic->growth_treshold) {
      pkVar6 = (keynode *)malloc(0x18);
      pkVar6->len = (uint8_t)keyn;
      pcVar7 = (char *)malloc((long)keyn);
      pkVar6->key = pcVar7;
      memcpy(pcVar7,key,(long)keyn);
      pkVar6->next = (keynode *)0x0;
      pkVar6->value = -1;
      ppkVar1[(int)uVar9] = pkVar6;
      dic->value = &dic->table[(int)uVar9]->value;
      dic->count = iVar3 + 1;
      return 0;
    }
    dic_resize(dic,(int)(dVar11 * dic->growth_factor));
  }
  pkVar5 = pkVar6;
  while (((uint)pkVar5->len != keyn || (iVar3 = bcmp(pkVar5->key,key,(ulong)(uint)keyn), iVar3 != 0)
         )) {
    pkVar5 = pkVar5->next;
    if (pkVar5 == (keynode *)0x0) {
      dic->count = dic->count + 1;
      pkVar5 = (keynode *)malloc(0x18);
      pkVar5->len = (uint8_t)keyn;
      pcVar7 = (char *)malloc((long)keyn);
      pkVar5->key = pcVar7;
      memcpy(pcVar7,key,(long)keyn);
      pkVar5->value = -1;
      pkVar5->next = pkVar6;
      ppkVar1[(int)uVar9] = pkVar5;
      dic->value = &pkVar5->value;
      return 0;
    }
  }
  dic->value = &pkVar5->value;
  return 1;
}

Assistant:

int dic_add(struct dictionary* dic, void *key, int keyn) {
	int n = hash_func((const char*)key, keyn) % dic->length;
	if (dic->table[n] == 0) {
		double f = (double)dic->count / (double)dic->length;
		if (f > dic->growth_treshold) {
			dic_resize(dic, dic->length * dic->growth_factor);
			return dic_add(dic, key, keyn);
		}
		dic->table[n] = keynode_new((char*)key, keyn);
		dic->value = &dic->table[n]->value;
		dic->count++;
		return 0;
	}
	struct keynode *k = dic->table[n];
	while (k) {
		if (k->len == keyn && memcmp(k->key, key, keyn) == 0) {
			dic->value = &k->value;
			return 1;
		}
		k = k->next;
	}
	dic->count++;
	struct keynode *k2 = keynode_new((char*)key, keyn);
	k2->next = dic->table[n];
	dic->table[n] = k2;
	dic->value = &k2->value;
	return 0;
}